

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdevicediscovery_p.cpp
# Opt level: O0

void QDeviceDiscovery::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  QtMocHelpers *in_RCX;
  int in_EDX;
  int in_ESI;
  QDeviceDiscovery *_t;
  uint in_stack_ffffffffffffffb8;
  QDeviceDiscovery *in_stack_ffffffffffffffc0;
  
  if (in_ESI == 0) {
    if (in_EDX == 0) {
      deviceDetected(in_stack_ffffffffffffffc0,(QString *)(ulong)in_stack_ffffffffffffffb8);
    }
    else if (in_EDX == 1) {
      deviceRemoved(in_stack_ffffffffffffffc0,(QString *)CONCAT44(1,in_stack_ffffffffffffffb8));
    }
  }
  if ((in_ESI == 5) &&
     (bVar1 = QtMocHelpers::indexOfMethod<void(QDeviceDiscovery::*)(QString_const&)>
                        (in_RCX,(void **)deviceDetected,0,0), !bVar1)) {
    QtMocHelpers::indexOfMethod<void(QDeviceDiscovery::*)(QString_const&)>
              (in_RCX,(void **)deviceRemoved,0,1);
  }
  return;
}

Assistant:

void QDeviceDiscovery::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDeviceDiscovery *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->deviceDetected((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 1: _t->deviceRemoved((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QDeviceDiscovery::*)(const QString & )>(_a, &QDeviceDiscovery::deviceDetected, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDeviceDiscovery::*)(const QString & )>(_a, &QDeviceDiscovery::deviceRemoved, 1))
            return;
    }
}